

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  int *piVar1;
  short *psVar2;
  ImWchar *pIVar3;
  float fVar4;
  short sVar5;
  ushort uVar6;
  unsigned_short *puVar7;
  StbUndoRecord *pSVar8;
  bool bVar9;
  int temp;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ImStb *pIVar14;
  int temp_1;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined8 in_R8;
  float fVar20;
  float fVar21;
  StbFindState find;
  uchar local_71;
  ImWchar *local_58;
  ImStb *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->Stb;
  local_50 = (ImStb *)&(this->Stb).preferred_x;
  do {
    switch(key) {
    case 0x10000:
      iVar12 = (this->Stb).select_start;
      iVar15 = (this->Stb).select_end;
      if (iVar12 == iVar15) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar15 < iVar12) {
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar15;
        }
        iVar12 = (this->Stb).select_start;
        (this->Stb).cursor = iVar12;
        (this->Stb).select_end = iVar12;
        (this->Stb).has_preferred_x = '\0';
      }
      goto LAB_0017b57a;
    case 0x10001:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImStb::stb_textedit_move_to_last(this,state);
      }
      ImStb::stb_textedit_clamp(this,state);
      goto LAB_0017b57a;
    case 0x10002:
switchD_0017ac82_caseD_10002:
      local_71 = (this->Stb).single_line;
      if (local_71 == '\0') {
        iVar12 = (this->Stb).select_start;
        iVar15 = (this->Stb).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar12 != iVar15) {
            if (iVar15 < iVar12) {
              (this->Stb).select_end = iVar12;
              (this->Stb).select_start = iVar15;
            }
            iVar12 = (this->Stb).select_start;
            (this->Stb).cursor = iVar12;
            (this->Stb).select_end = iVar12;
            (this->Stb).has_preferred_x = '\0';
          }
        }
        else if (iVar12 == iVar15) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar15;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        iVar12 = local_34;
        if (local_34 != local_3c) {
          pIVar14 = local_50;
          if ((this->Stb).has_preferred_x == '\0') {
            pIVar14 = (ImStb *)local_48;
          }
          fVar4 = *(float *)pIVar14;
          (this->Stb).cursor = local_34;
          puVar7 = (this->TextW).Data;
          local_58 = (ImWchar *)0x0;
          pIVar3 = puVar7 + local_34;
          InputTextCalcTextSizeW
                    (pIVar3,puVar7 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar15 = (int)((ulong)((long)local_58 - (long)pIVar3) >> 1);
          if (0 < iVar15) {
            fVar21 = 0.0;
            iVar10 = 1;
            do {
              fVar20 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar12,iVar10 + -1);
              if (((fVar20 == -1.0) && (!NAN(fVar20))) || (fVar21 = fVar21 + fVar20, fVar4 < fVar21)
                 ) {
                bVar9 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar9 = true;
              }
            } while ((bVar9) && (bVar9 = iVar10 < iVar15, iVar10 = iVar10 + 1, bVar9));
          }
          goto LAB_0017af31;
        }
      }
      else {
        key = key & 0x20000U | 0x10000;
      }
      break;
    case 0x10003:
switchD_0017ac82_caseD_10003:
      local_71 = (this->Stb).single_line;
      if (local_71 == '\0') {
        iVar12 = (this->Stb).select_start;
        iVar15 = (this->Stb).select_end;
        if ((key & 0x20000U) == 0) {
          if (iVar12 != iVar15) {
            ImStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar12 == iVar15) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar15;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        if ((long)local_38 == 0) break;
        pIVar14 = local_50;
        if ((this->Stb).has_preferred_x == '\0') {
          pIVar14 = (ImStb *)local_48;
        }
        fVar4 = *(float *)pIVar14;
        lVar16 = (long)local_3c + (long)local_38;
        iVar12 = (int)lVar16;
        (this->Stb).cursor = iVar12;
        puVar7 = (this->TextW).Data;
        local_58 = (ImWchar *)0x0;
        pIVar3 = puVar7 + lVar16;
        InputTextCalcTextSizeW(pIVar3,puVar7 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0))
        ;
        iVar15 = (int)((ulong)((long)local_58 - (long)pIVar3) >> 1);
        if (0 < iVar15) {
          fVar21 = 0.0;
          iVar10 = 1;
          do {
            fVar20 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar12,iVar10 + -1);
            if (((fVar20 == -1.0) && (!NAN(fVar20))) || (fVar21 = fVar21 + fVar20, fVar4 < fVar21))
            {
              bVar9 = false;
            }
            else {
              state->cursor = state->cursor + 1;
              bVar9 = true;
            }
          } while ((bVar9) && (bVar9 = iVar10 < iVar15, iVar10 = iVar10 + 1, bVar9));
        }
LAB_0017af31:
        ImStb::stb_textedit_clamp(this,state);
        (this->Stb).has_preferred_x = '\x01';
        (this->Stb).preferred_x = fVar4;
        if ((key & 0x20000U) != 0) {
          (this->Stb).select_end = (this->Stb).cursor;
        }
      }
      else {
        key = key & 0x20000U | 0x10001;
      }
      break;
    case 0x10004:
      ImStb::stb_textedit_clamp(this,state);
      iVar12 = (this->Stb).select_start;
      iVar15 = (this->Stb).select_end;
      if (iVar12 != iVar15) {
        if (iVar15 < iVar12) {
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar15;
        }
        iVar12 = (this->Stb).select_start;
        (this->Stb).cursor = iVar12;
        (this->Stb).select_end = iVar12;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = 0;
        goto LAB_0017b57a;
      }
      iVar12 = state->cursor;
      if ((long)iVar12 < 1) goto LAB_0017b57a;
      if ((this->TextW).Size < iVar12) goto LAB_0017b8cf;
      puVar7 = (this->TextW).Data;
      lVar16 = (long)iVar12;
      goto LAB_0017b5b4;
    case 0x10005:
      iVar12 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      iVar15 = (this->Stb).select_start;
      iVar10 = (this->Stb).select_end;
      if (iVar15 != iVar10) {
        if (iVar10 < iVar15) {
          (this->Stb).select_end = iVar15;
          (this->Stb).select_start = iVar10;
        }
        iVar15 = (this->Stb).select_start;
        (this->Stb).cursor = iVar15;
        (this->Stb).select_end = iVar15;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = iVar12;
        goto LAB_0017b57a;
      }
      iVar15 = state->cursor;
      if (iVar12 <= iVar15) goto LAB_0017b57a;
      iVar10 = (this->TextW).Size;
      if (iVar10 <= iVar15) {
        iVar10 = iVar15;
      }
      puVar7 = (this->TextW).Data;
      lVar16 = 0;
      goto LAB_0017b5fb;
    case 0x10006:
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      (this->Stb).select_start = 0;
      goto LAB_0017b57a;
    case 0x10007:
      (this->Stb).cursor = this->CurLenW;
      (this->Stb).select_start = 0;
      (this->Stb).select_end = 0;
      goto LAB_0017b57a;
    case 0x10008:
switchD_0017ac82_caseD_10008:
      if ((this->Stb).select_start != (this->Stb).select_end) goto LAB_0017afe9;
      iVar12 = (this->Stb).cursor;
      if (iVar12 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar12,1);
      }
      goto LAB_0017b57a;
    case 0x10009:
switchD_0017ac82_caseD_10009:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_clamp(this,state);
        iVar12 = (this->Stb).cursor;
        if (0 < iVar12) {
          ImStb::stb_textedit_delete(this,state,iVar12 + -1,1);
          (this->Stb).cursor = (this->Stb).cursor + -1;
        }
      }
      else {
LAB_0017afe9:
        ImStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_0017b57a;
    case 0x1000a:
      lVar16 = (long)(this->Stb).undostate.undo_point;
      if (lVar16 == 0) goto LAB_0017b57a;
      iVar12 = (this->Stb).undostate.undo_rec[lVar16 + -1].where;
      iVar15 = (this->Stb).undostate.undo_rec[lVar16 + -1].insert_length;
      uVar11 = (this->Stb).undostate.undo_rec[lVar16 + -1].delete_length;
      sVar5 = (this->Stb).undostate.redo_point;
      uVar19 = (ulong)sVar5;
      iVar10 = (this->Stb).undostate.undo_rec[lVar16 + -1].char_storage;
      (this->Stb).undostate.undo_rec[uVar19 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar19 - 1].insert_length = uVar11;
      (this->Stb).undostate.undo_rec[uVar19 - 1].delete_length = iVar15;
      (this->Stb).undostate.undo_rec[uVar19 - 1].where = iVar12;
      if ((ulong)uVar11 == 0) goto LAB_0017b894;
      iVar18 = (this->Stb).undostate.undo_char_point + uVar11;
      if (0x3e6 < iVar18) {
        (this->Stb).undostate.undo_rec[uVar19 - 1].insert_length = 0;
        goto LAB_0017b881;
      }
      iVar13 = (this->Stb).undostate.redo_char_point;
      bVar9 = iVar13 < iVar18;
      if (iVar18 <= iVar13) goto LAB_0017b811;
      if (sVar5 == 99) goto LAB_0017b57a;
      local_50 = (ImStb *)&(this->Stb).undostate.undo_rec[0].char_storage;
      goto LAB_0017b69f;
    case 0x1000b:
      lVar16 = (long)(this->Stb).undostate.redo_point;
      if (lVar16 == 99) goto LAB_0017b57a;
      sVar5 = (this->Stb).undostate.undo_point;
      iVar12 = (this->Stb).undostate.undo_rec[lVar16].where;
      iVar15 = (this->Stb).undostate.undo_rec[lVar16].insert_length;
      uVar11 = (this->Stb).undostate.undo_rec[lVar16].delete_length;
      iVar10 = (this->Stb).undostate.undo_rec[lVar16].char_storage;
      (this->Stb).undostate.undo_rec[sVar5].delete_length = iVar15;
      (this->Stb).undostate.undo_rec[sVar5].insert_length = uVar11;
      (this->Stb).undostate.undo_rec[sVar5].where = iVar12;
      (this->Stb).undostate.undo_rec[sVar5].char_storage = -1;
      if ((ulong)uVar11 == 0) goto LAB_0017b7d6;
      iVar18 = (this->Stb).undostate.undo_char_point;
      if ((this->Stb).undostate.redo_char_point < (int)(iVar18 + uVar11)) {
        pSVar8 = (this->Stb).undostate.undo_rec + sVar5;
        pSVar8->insert_length = 0;
        pSVar8->delete_length = 0;
        goto LAB_0017b7cb;
      }
      (this->Stb).undostate.undo_rec[sVar5].char_storage = iVar18;
      (this->Stb).undostate.undo_char_point = iVar18 + uVar11;
      if ((int)uVar11 < 1) goto LAB_0017b7cb;
      iVar13 = (this->TextW).Size;
      if (iVar13 < iVar12) {
        iVar13 = iVar12;
      }
      puVar7 = (this->TextW).Data;
      uVar19 = 0;
      goto LAB_0017b7b0;
    case 0x1000c:
      iVar12 = (this->Stb).select_start;
      iVar15 = (this->Stb).select_end;
      if (iVar12 == iVar15) {
        iVar12 = state->cursor;
        goto LAB_0017b14f;
      }
      if (iVar15 < iVar12) {
        (this->Stb).select_end = iVar12;
        (this->Stb).select_start = iVar15;
      }
      iVar12 = (this->Stb).select_start;
      (this->Stb).cursor = iVar12;
      goto LAB_0017b577;
    case 0x1000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar12 = this->CurLenW;
        iVar15 = (this->Stb).cursor;
        goto LAB_0017b1c0;
      }
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_0017b57e;
    default:
      switch(key) {
      case 0x30000:
        ImStb::stb_textedit_clamp(this,state);
        iVar12 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar12) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar12;
        }
        iVar12 = (this->Stb).select_end;
        if (0 < iVar12) {
          (this->Stb).select_end = iVar12 + -1;
        }
        break;
      case 0x30001:
        iVar12 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar12) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar12;
        }
        piVar1 = &(this->Stb).select_end;
        *piVar1 = *piVar1 + 1;
        ImStb::stb_textedit_clamp(this,state);
        break;
      case 0x30002:
        goto switchD_0017ac82_caseD_10002;
      case 0x30003:
        goto switchD_0017ac82_caseD_10003;
      case 0x30004:
        ImStb::stb_textedit_clamp(this,state);
        iVar12 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar12) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar12;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = 0;
          goto LAB_0017b574;
        }
        iVar12 = state->cursor;
        if ((long)iVar12 < 1) goto LAB_0017b574;
        if ((this->TextW).Size < iVar12) goto LAB_0017b8cf;
        puVar7 = (this->TextW).Data;
        lVar16 = (long)iVar12;
        goto LAB_0017b50e;
      case 0x30005:
        iVar12 = this->CurLenW;
        ImStb::stb_textedit_clamp(this,state);
        iVar15 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar15) {
          iVar15 = (this->Stb).cursor;
          (this->Stb).select_end = iVar15;
          (this->Stb).select_start = iVar15;
        }
        else {
          state->cursor = iVar15;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = iVar12;
          goto LAB_0017b574;
        }
        iVar15 = state->cursor;
        if (iVar12 <= iVar15) goto LAB_0017b574;
        iVar10 = (this->TextW).Size;
        if (iVar10 <= iVar15) {
          iVar10 = iVar15;
        }
        puVar7 = (this->TextW).Data;
        lVar16 = 0;
        goto LAB_0017b555;
      case 0x30006:
        iVar12 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar12) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar12;
        }
        iVar12 = 0;
        goto LAB_0017b47e;
      case 0x30007:
        iVar12 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar12) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        else {
          state->cursor = iVar12;
        }
        iVar12 = this->CurLenW;
LAB_0017b47e:
        (this->Stb).select_end = iVar12;
        goto LAB_0017b481;
      case 0x30008:
        goto switchD_0017ac82_caseD_10008;
      case 0x30009:
        goto switchD_0017ac82_caseD_10009;
      default:
        uVar11 = 0;
        if (key < 0x10000) {
          uVar11 = key;
        }
        if (((int)uVar11 < 1) ||
           ((local_48[0] = (ImWchar)uVar11, uVar11 == 10 && ((this->Stb).single_line != '\0'))))
        goto LAB_0017b57e;
        if (((this->Stb).insert_mode == '\0') ||
           (((this->Stb).select_start != (this->Stb).select_end ||
            (iVar12 = (this->Stb).cursor, this->CurLenW <= iVar12)))) {
          ImStb::stb_textedit_delete_selection(this,state);
          bVar9 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar9) goto LAB_0017b57e;
          ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
        }
        else {
          ImStb::stb_text_makeundo_replace(this,state,iVar12,0x1a3440,(int)in_R8);
          ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
          bVar9 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar9) goto LAB_0017b57e;
        }
        (this->Stb).cursor = (this->Stb).cursor + 1;
        goto LAB_0017b57a;
      case 0x3000c:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        iVar12 = state->cursor;
        goto LAB_0017b08c;
      case 0x3000d:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar12 = (this->Stb).cursor;
          (this->Stb).select_end = iVar12;
          (this->Stb).select_start = iVar12;
        }
        iVar12 = this->CurLenW;
        iVar15 = (this->Stb).cursor;
        goto LAB_0017b0e8;
      }
      iVar12 = (this->Stb).select_end;
LAB_0017b481:
      (this->Stb).cursor = iVar12;
      goto LAB_0017b57a;
    }
  } while (local_71 != '\0');
  goto LAB_0017b57e;
  while (iVar10 = ImStb::is_word_boundary_from_right(this,iVar15), iVar10 == 0) {
LAB_0017b0e8:
    iVar15 = iVar15 + 1;
    if (iVar12 <= iVar15) break;
  }
  if (iVar15 < iVar12) {
    iVar12 = iVar15;
  }
  (this->Stb).cursor = iVar12;
  (this->Stb).select_end = iVar12;
  goto LAB_0017b1e4;
  while (iVar10 = ImStb::is_word_boundary_from_right(this,iVar15), iVar12 = iVar15, iVar10 == 0) {
LAB_0017b08c:
    iVar15 = iVar12 + -1;
    if (iVar12 < 1) break;
  }
  iVar12 = 0;
  if (0 < iVar15) {
    iVar12 = iVar15;
  }
  (this->Stb).cursor = iVar12;
  (this->Stb).select_end = iVar12;
  goto LAB_0017b1e4;
  while( true ) {
    state->cursor = iVar15 + 1 + (int)lVar16;
    lVar16 = lVar16 + 1;
    if (iVar12 - iVar15 == (int)lVar16) break;
LAB_0017b555:
    if ((long)iVar10 - (long)iVar15 == lVar16) goto LAB_0017b8cf;
    if (puVar7[iVar15 + lVar16] == 10) break;
  }
  goto LAB_0017b574;
  while( true ) {
    state->cursor = (int)lVar16 + -1;
    bVar9 = lVar16 < 2;
    lVar16 = lVar16 + -1;
    if (bVar9) break;
LAB_0017b50e:
    if (puVar7[lVar16 + -1] == 10) break;
  }
LAB_0017b574:
  iVar12 = (this->Stb).cursor;
LAB_0017b577:
  (this->Stb).select_end = iVar12;
  goto LAB_0017b57a;
  while (iVar10 = ImStb::is_word_boundary_from_right(this,iVar15), iVar10 == 0) {
LAB_0017b1c0:
    iVar15 = iVar15 + 1;
    if (iVar12 <= iVar15) break;
  }
  if (iVar15 < iVar12) {
    iVar12 = iVar15;
  }
  (this->Stb).cursor = iVar12;
  goto LAB_0017b1e4;
  while (iVar10 = ImStb::is_word_boundary_from_right(this,iVar15), iVar12 = iVar15, iVar10 == 0) {
LAB_0017b14f:
    iVar15 = iVar12 + -1;
    if (iVar12 < 1) break;
  }
  iVar12 = 0;
  if (0 < iVar15) {
    iVar12 = iVar15;
  }
  (this->Stb).cursor = iVar12;
LAB_0017b1e4:
  ImStb::stb_textedit_clamp(this,state);
  goto LAB_0017b57e;
  while( true ) {
    (this->Stb).undostate.undo_char[(long)iVar18 + uVar19] = puVar7[(long)iVar12 + uVar19];
    uVar19 = uVar19 + 1;
    if (uVar11 == uVar19) break;
LAB_0017b7b0:
    if ((uint)(iVar13 - iVar12) == uVar19) goto LAB_0017b8cf;
  }
LAB_0017b7cb:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar11);
LAB_0017b7d6:
  if (iVar15 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar10,iVar15);
    piVar1 = &(this->Stb).undostate.redo_char_point;
    *piVar1 = *piVar1 + iVar15;
  }
  (this->Stb).cursor = iVar15 + iVar12;
  psVar2 = &(this->Stb).undostate.undo_point;
  *psVar2 = *psVar2 + 1;
  psVar2 = &(this->Stb).undostate.redo_point;
  *psVar2 = *psVar2 + 1;
  goto LAB_0017b57a;
  while (uVar6 = (this->Stb).undostate.redo_point, uVar19 = (ulong)uVar6, uVar6 != 99) {
LAB_0017b69f:
    if ((short)uVar19 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar18 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        lVar16 = (long)(this->Stb).undostate.redo_char_point + (long)iVar18;
        iVar13 = (int)lVar16;
        (this->Stb).undostate.redo_char_point = iVar13;
        pIVar3 = (this->Stb).undostate.undo_char + lVar16;
        memmove(pIVar3,pIVar3 + -(long)iVar18,(long)(999 - iVar13) * 2);
        lVar16 = (long)(this->Stb).undostate.redo_point;
        if (lVar16 < 0x62) {
          lVar17 = lVar16 + -0x62;
          pIVar14 = local_50 + lVar16 * 0x10;
          do {
            if (-1 < *(int *)pIVar14) {
              *(int *)pIVar14 = *(int *)pIVar14 + iVar18;
            }
            pIVar14 = pIVar14 + 0x10;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0);
        }
      }
      lVar16 = (long)(this->Stb).undostate.redo_point;
      if (lVar16 < 0) {
        __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imstb_textedit.h"
                      ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
      }
      memmove((this->Stb).undostate.undo_rec + lVar16 + 1,(this->Stb).undostate.undo_rec + lVar16,
              lVar16 * -0x10 + 0x620);
      psVar2 = &(this->Stb).undostate.redo_point;
      *psVar2 = *psVar2 + 1;
    }
    iVar18 = (this->Stb).undostate.undo_char_point + uVar11;
    iVar13 = (this->Stb).undostate.redo_char_point;
    bVar9 = iVar13 < iVar18;
    if (iVar18 <= iVar13) goto LAB_0017b811;
  }
  goto LAB_0017b57a;
LAB_0017b811:
  (this->Stb).undostate.undo_rec[(long)(this->Stb).undostate.redo_point + -1].char_storage =
       iVar13 - uVar11;
  (this->Stb).undostate.redo_char_point = iVar13 - uVar11;
  if (0 < (int)uVar11) {
    iVar18 = (this->TextW).Size;
    if (iVar18 < iVar12) {
      iVar18 = iVar12;
    }
    puVar7 = (this->TextW).Data;
    uVar19 = 0;
    do {
      if ((uint)(iVar18 - iVar12) == uVar19) goto LAB_0017b8cf;
      *(unsigned_short *)
       ((long)this + uVar19 * 2 + (long)iVar13 * 2 + (long)(int)uVar11 * -2 + 0x694) =
           puVar7[(long)iVar12 + uVar19];
      uVar19 = uVar19 + 1;
    } while (uVar11 != uVar19);
  }
  if (!bVar9) {
LAB_0017b881:
    ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar12,uVar11);
LAB_0017b894:
    if (iVar15 != 0) {
      ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar12,(this->Stb).undostate.undo_char + iVar10,iVar15);
      piVar1 = &(this->Stb).undostate.undo_char_point;
      *piVar1 = *piVar1 - iVar15;
    }
    (this->Stb).cursor = iVar15 + iVar12;
    psVar2 = &(this->Stb).undostate.undo_point;
    *psVar2 = *psVar2 + -1;
    psVar2 = &(this->Stb).undostate.redo_point;
    *psVar2 = *psVar2 + -1;
  }
  goto LAB_0017b57a;
  while( true ) {
    state->cursor = iVar15 + 1 + (int)lVar16;
    lVar16 = lVar16 + 1;
    if (iVar12 - iVar15 == (int)lVar16) break;
LAB_0017b5fb:
    if ((long)iVar10 - (long)iVar15 == lVar16) {
LAB_0017b8cf:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                    ,0x4d9,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    if (puVar7[iVar15 + lVar16] == 10) break;
  }
  goto LAB_0017b57a;
  while( true ) {
    state->cursor = (int)lVar16 + -1;
    bVar9 = lVar16 < 2;
    lVar16 = lVar16 + -1;
    if (bVar9) break;
LAB_0017b5b4:
    if (puVar7[lVar16 + -1] == 10) break;
  }
LAB_0017b57a:
  (this->Stb).has_preferred_x = '\0';
LAB_0017b57e:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}